

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O0

void __thiscall DSDcc::DSDdPMR::processSuperFrame(DSDdPMR *this)

{
  int iVar1;
  DSDLogger *this_00;
  undefined8 *in_RDI;
  double __x;
  DSDDecoder *unaff_retaddr;
  int dibit;
  int in_stack_00000068;
  int in_stack_0000006c;
  DSDdPMR *in_stack_00000070;
  int dibit_00;
  int symbolIndex;
  undefined4 in_stack_fffffffffffffff0;
  int dibit_01;
  undefined8 *puVar2;
  int symbolIndex_00;
  
  puVar2 = in_RDI;
  iVar1 = DSDSymbol::getDibit((DSDSymbol *)0x128731);
  if (*(int *)(in_RDI + 7) == 0) {
    *(undefined4 *)((long)in_RDI + 0xc) = 3;
    *(undefined4 *)((long)in_RDI + 0x3c) = 0;
    this_00 = DSDDecoder::getLogger((DSDDecoder *)*in_RDI);
    DSDLogger::log(this_00,__x);
  }
  dibit_01 = (int)puVar2;
  symbolIndex_00 = (int)((ulong)puVar2 >> 0x20);
  if (*(int *)(in_RDI + 7) < 0x24) {
    *(undefined1 *)((long)in_RDI + 0x504) = 0;
    *(undefined1 *)((long)in_RDI + 0x505) = 0;
    processCCH((DSDdPMR *)unaff_retaddr,symbolIndex_00,dibit_01);
    *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
  }
  else {
    dibit_00 = (int)in_RDI;
    symbolIndex = (int)((ulong)in_RDI >> 0x20);
    if (*(int *)(in_RDI + 7) < 0xb4) {
      processTCH((DSDdPMR *)CONCAT44(iVar1,in_stack_fffffffffffffff0),symbolIndex,dibit_00);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0xc0) {
      processColourCode((DSDdPMR *)unaff_retaddr,symbolIndex_00,dibit_01);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0xe4) {
      processCCH((DSDdPMR *)unaff_retaddr,symbolIndex_00,dibit_01);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0x174) {
      processTCH((DSDdPMR *)CONCAT44(iVar1,in_stack_fffffffffffffff0),symbolIndex,dibit_00);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0x180) {
      processFS2(in_stack_00000070,in_stack_0000006c,in_stack_00000068);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0x1a4) {
      processCCH((DSDdPMR *)unaff_retaddr,symbolIndex_00,dibit_01);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0x234) {
      processTCH((DSDdPMR *)CONCAT44(iVar1,in_stack_fffffffffffffff0),symbolIndex,dibit_00);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0x240) {
      processColourCode((DSDdPMR *)unaff_retaddr,symbolIndex_00,dibit_01);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0x264) {
      processCCH((DSDdPMR *)unaff_retaddr,symbolIndex_00,dibit_01);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
    }
    else if (*(int *)(in_RDI + 7) < 0x2f4) {
      processTCH((DSDdPMR *)CONCAT44(iVar1,in_stack_fffffffffffffff0),symbolIndex,dibit_00);
      *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
      if (*(int *)(in_RDI + 7) == 0x2f4) {
        *(undefined4 *)((long)in_RDI + 0xc) = 0;
        *(undefined4 *)(in_RDI + 1) = 1;
        *(undefined4 *)(in_RDI + 7) = 0;
      }
    }
    else {
      *(undefined4 *)((long)in_RDI + 0xc) = 0;
      DSDDecoder::resetFrameSync(unaff_retaddr);
    }
  }
  return;
}

Assistant:

void DSDdPMR::processSuperFrame()
{
    int dibit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get di-bit from symbol

    if (m_symbolIndex == 0) // new frame
    {
        m_frameType = DPMRPayloadFrame;
        m_frameIndex = 0;
        m_dsdDecoder->getLogger().log("DSDdPMR::processSuperFrame: start\n"); // DEBUG
    }

    if (m_symbolIndex < 36) // Start of frame 0 - CCH0
    {
        m_calledIdHalf = false;
        m_ownIdHalf = false;
        processCCH(m_symbolIndex, dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144) // TCH0
    {
        processTCH(m_symbolIndex - 36, dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12) // Start of frame 1 - CC0
    {
        processColourCode(m_symbolIndex - (36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36) // CCH1
    {
        processCCH(m_symbolIndex - (36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144) // TCH1
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12) // Start of frame 2 - FS2-1
    {
        processFS2(m_symbolIndex - (36 + 144 + 12 + 36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36) // CCH2
    {
        processCCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // TCH2
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12) // Start of frame 3 - CC1
    {
        processColourCode(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36) // CCH3
    {
        processCCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // TCH3
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;

        if (m_symbolIndex == 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // end of super frame
        {
            m_frameType = DPMRNoFrame; // look for continuation or end
            m_state = DPMRPostFrame;
            m_symbolIndex = 0;
        }
    }
    else // shouldn´t go there => out of sync error
    {
    	m_frameType = DPMRNoFrame;
        m_dsdDecoder->resetFrameSync(); // end
    }
}